

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O2

void matrixVectorTest1(void)

{
  ostream *poVar1;
  Vector4T<float> a;
  Vector4T<float> b;
  AffineMatrix4 B;
  Matrix4 A;
  Matrix<float,_4UL,_4UL> local_138;
  Vector4T<float> local_f8;
  Matrix<float,_4UL,_4UL> local_e8;
  AffineMatrix4T<float> local_a0;
  Matrix<float,_4UL,_4UL> local_70;
  
  Gs::Matrix<float,_4UL,_4UL>::Identity();
  Gs::AffineMatrix4T<float>::Identity();
  local_138.m_[0] = 4.0;
  local_138.m_[1] = 2.0;
  local_138.m_[2] = -1.6666666;
  Gs::Translate<float>(&local_70,(Vector3T<float> *)&local_138);
  local_138.m_[0] = 1.0;
  local_138.m_[1] = 2.0;
  local_138.m_[2] = 3.0;
  Gs::Details::Scale3x3<Gs::AffineMatrix4T<float>,float>(&local_a0,(Vector3T<float> *)&local_138);
  local_138.m_[0] = 4.0;
  local_138.m_[1] = 2.0;
  local_138.m_[2] = -1.6666666;
  Gs::Details::Translate<Gs::AffineMatrix4T<float>,float>(&local_a0,(Vector3T<float> *)&local_138);
  poVar1 = std::operator<<((ostream *)&std::cout,"A = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Gs::operator<<(poVar1,&local_70);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"B = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>(poVar1,&local_a0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"A^-1 = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  Gs::Matrix<float,_4UL,_4UL>::Inverse(&local_138,&local_70);
  poVar1 = Gs::operator<<(poVar1,&local_138);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"A*A^-1 = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  Gs::Matrix<float,_4UL,_4UL>::Inverse(&local_e8,&local_70);
  Gs::operator*(&local_138,&local_70,&local_e8);
  poVar1 = Gs::operator<<(poVar1,&local_138);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_e8.m_[0] = 0.0;
  local_e8.m_[1] = 0.0;
  local_e8.m_[2] = 0.0;
  local_e8.m_[3] = 1.0;
  Gs::TransformVector<Gs::Matrix<float,4ul,4ul>,float>(&local_70,(Vector4T<float> *)&local_e8);
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  local_f8.z = 0.0;
  local_f8.w = 1.0;
  Gs::TransformVector<float>(&local_a0,&local_f8);
  poVar1 = std::operator<<((ostream *)&std::cout,"a = ");
  poVar1 = Gs::operator<<(poVar1,(Vector<float,_4UL> *)&local_138);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"b = ");
  poVar1 = Gs::operator<<(poVar1,(Vector<float,_4UL> *)&local_e8);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void matrixVectorTest1()
{
    Matrix4 A = Matrix4::Identity();
    AffineMatrix4 B = AffineMatrix4::Identity();

    Translate(A, Vector3(4, 2, -5.0f/3.0f));
    Scale(B, Vector3(1, 2, 3));
    Translate(B, Vector3(4, 2, -5.0f/3.0f));

    #if 1
    std::cout << "A = " << std::endl << A << std::endl;
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "A^-1 = " << std::endl << A.Inverse() << std::endl;
    std::cout << "A*A^-1 = " << std::endl << A*A.Inverse() << std::endl;
    #endif

    auto a = TransformVector(A, Vector4(0, 0, 0, 1));
    auto b = TransformVector(B, Vector4(0, 0, 0, 1));

    //Translate(A, a.xyz()*2.0f);
    //Translate(B, a.yxz());

    std::cout << "a = " << a << std::endl;
    std::cout << "b = " << b << std::endl;
}